

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bend.hpp
# Opt level: O3

RealType __thiscall OpenMD::Bend::getValue(Bend *this,int snapshotNo)

{
  undefined4 *puVar1;
  double *pdVar2;
  double dVar3;
  Atom *pAVar4;
  SnapshotManager *pSVar5;
  double dVar6;
  uint i;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar9;
  double tmp;
  double dVar10;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  Vector3d local_d8;
  double local_b8 [4];
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  Vector3d local_78;
  double local_58 [4];
  undefined8 local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  
  pAVar4 = *(this->super_ShortRangeInteraction).atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar7 = (*((pAVar4->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
  lVar9 = (long)(pAVar4->super_StuntDouble).localIndex_;
  lVar8 = *(long *)(CONCAT44(extraout_var,iVar7) + (pAVar4->super_StuntDouble).storage_);
  puVar1 = (undefined4 *)(lVar8 + lVar9 * 0x18);
  local_38._0_4_ = *puVar1;
  local_38._4_4_ = puVar1[1];
  uStack_30 = puVar1[2];
  uStack_2c = puVar1[3];
  local_28 = *(undefined8 *)(lVar8 + 0x10 + lVar9 * 0x18);
  pAVar4 = (this->super_ShortRangeInteraction).atoms_.
           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
           super__Vector_impl_data._M_start[1];
  pSVar5 = (pAVar4->super_StuntDouble).snapshotMan_;
  iVar7 = (*pSVar5->_vptr_SnapshotManager[4])(pSVar5,snapshotNo);
  lVar9 = (long)(pAVar4->super_StuntDouble).localIndex_;
  lVar8 = *(long *)(CONCAT44(extraout_var_00,iVar7) + (pAVar4->super_StuntDouble).storage_);
  puVar1 = (undefined4 *)(lVar8 + lVar9 * 0x18);
  local_98._0_4_ = *puVar1;
  local_98._4_4_ = puVar1[1];
  uStack_90 = puVar1[2];
  uStack_8c = puVar1[3];
  local_88 = *(undefined8 *)(lVar8 + 0x10 + lVar9 * 0x18);
  pAVar4 = (this->super_ShortRangeInteraction).atoms_.
           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
           super__Vector_impl_data._M_start[2];
  pSVar5 = (pAVar4->super_StuntDouble).snapshotMan_;
  iVar7 = (*pSVar5->_vptr_SnapshotManager[4])(pSVar5,snapshotNo);
  lVar9 = (long)(pAVar4->super_StuntDouble).localIndex_;
  lVar8 = *(long *)(CONCAT44(extraout_var_01,iVar7) + (pAVar4->super_StuntDouble).storage_);
  pdVar2 = (double *)(lVar8 + lVar9 * 0x18);
  local_58[0] = *pdVar2;
  local_58[1] = pdVar2[1];
  local_58[2] = (double)*(undefined8 *)(lVar8 + 0x10 + lVar9 * 0x18);
  local_d8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_d8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_d8.super_Vector<double,_3U>.data_[2] = 0.0;
  lVar8 = 0;
  do {
    local_d8.super_Vector<double,_3U>.data_[lVar8] =
         (double)(&local_38)[lVar8] - (double)(&local_98)[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_78.super_Vector<double,_3U>.data_[2] = local_d8.super_Vector<double,_3U>.data_[2];
  local_78.super_Vector<double,_3U>.data_[0]._0_4_ =
       local_d8.super_Vector<double,_3U>.data_[0]._0_4_;
  local_78.super_Vector<double,_3U>.data_[0]._4_4_ =
       local_d8.super_Vector<double,_3U>.data_[0]._4_4_;
  local_78.super_Vector<double,_3U>.data_[1]._0_4_ =
       local_d8.super_Vector<double,_3U>.data_[1]._0_4_;
  local_78.super_Vector<double,_3U>.data_[1]._4_4_ =
       local_d8.super_Vector<double,_3U>.data_[1]._4_4_;
  pSVar5 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar7 = (*pSVar5->_vptr_SnapshotManager[4])(pSVar5,snapshotNo);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_02,iVar7),&local_78);
  dVar6 = 0.0;
  lVar8 = 0;
  do {
    dVar3 = local_78.super_Vector<double,_3U>.data_[lVar8];
    dVar6 = dVar6 + dVar3 * dVar3;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  lVar8 = 0;
  do {
    local_b8[lVar8] = local_58[lVar8] - (double)(&local_98)[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_d8.super_Vector<double,_3U>.data_[2] = local_b8[2];
  local_d8.super_Vector<double,_3U>.data_[0] = local_b8[0];
  local_d8.super_Vector<double,_3U>.data_[1] = local_b8[1];
  pSVar5 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar7 = (*pSVar5->_vptr_SnapshotManager[4])(pSVar5,snapshotNo);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_03,iVar7),&local_d8);
  dVar3 = 0.0;
  lVar8 = 0;
  do {
    dVar10 = local_d8.super_Vector<double,_3U>.data_[lVar8];
    dVar3 = dVar3 + dVar10 * dVar10;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar10 = 0.0;
  lVar8 = 0;
  do {
    dVar10 = dVar10 + local_78.super_Vector<double,_3U>.data_[lVar8] *
                      local_d8.super_Vector<double,_3U>.data_[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  dVar10 = dVar10 / (dVar6 * dVar3);
  dVar6 = 1.0;
  if ((dVar10 <= 1.0) && (dVar6 = dVar10, dVar10 < -1.0)) {
    dVar6 = -1.0;
  }
  dVar6 = acos(dVar6);
  return dVar6;
}

Assistant:

RealType getValue(int snapshotNo) {
      Vector3d pos1 = atoms_[0]->getPos(snapshotNo);
      Vector3d pos2 = atoms_[1]->getPos(snapshotNo);
      Vector3d pos3 = atoms_[2]->getPos(snapshotNo);

      Vector3d r21 = pos1 - pos2;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r21);
      RealType d21 = r21.length();

      Vector3d r23 = pos3 - pos2;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r23);
      RealType d23 = r23.length();

      RealType cosTheta = dot(r21, r23) / (d21 * d23);

      // check roundoff
      if (cosTheta > 1.0) {
        cosTheta = 1.0;
      } else if (cosTheta < -1.0) {
        cosTheta = -1.0;
      }

      return acos(cosTheta);
    }